

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void rtranspose(double *m,int rows,int cols,double *n,int r,int c)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  while ((0x40 < rows || (0x40 < cols))) {
    if (cols < rows) {
      dVar7 = ceil((double)rows * 0.5);
      iVar4 = (int)dVar7;
      rows = rows - iVar4;
      rtranspose(m,iVar4,cols,n,r,c);
      m = m + iVar4 * c;
      n = n + iVar4;
    }
    else {
      dVar7 = ceil((double)cols * 0.5);
      iVar4 = (int)dVar7;
      cols = cols - iVar4;
      rtranspose(m,rows,iVar4,n,r,c);
      m = m + iVar4;
      n = n + iVar4 * r;
    }
  }
  uVar1 = 0;
  uVar5 = (ulong)(uint)cols;
  if (cols < 1) {
    uVar5 = uVar1;
  }
  uVar6 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar6 = uVar1;
  }
  for (; uVar1 != uVar6; uVar1 = uVar1 + 1) {
    pdVar2 = n;
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      *pdVar2 = m[uVar3];
      pdVar2 = pdVar2 + r;
    }
    m = m + c;
    n = n + 1;
  }
  return;
}

Assistant:

void rtranspose(double *m, int rows, int cols,double *n, int r, int c) {
	register int i,j;
	int rm,cm;
	int rm1,cm1,rm2,cm2;
	int block;

	block = (int) BLOCKSIZE;

	if (rows <= block && cols <= block) {
		for (i = 0; i < rows; ++i) {
			for (j = 0; j < cols; ++j) {
				n[i+j*r] = m[j+i*c];
				//cout << *(n+i+j*r) << " ";
			}
		}
		//cout << endl;

	} else if (cols >= rows) {
		rm = rows;
		cm1 = (int) ceil((double) cols/2.0);
		cm2 = cols - cm1;

		rtranspose(m,rm,cm1,n,r,c);
		rtranspose(m+cm1,rm,cm2,n+cm1*r,r,c);
	} else if (rows > cols) {
		rm1 = (int) ceil((double) rows/2.0);
		rm2 = rows - rm1;
		cm = cols;
		rtranspose(m,rm1,cm,n,r,c);
		rtranspose(m+rm1*c,rm2,cm,n+rm1,r,c);
	}

}